

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O0

void CuStringAppend(CuString *str,char *text)

{
  int iVar1;
  size_t sVar2;
  char *pcStack_18;
  int length;
  char *text_local;
  CuString *str_local;
  
  pcStack_18 = text;
  if (text == (char *)0x0) {
    pcStack_18 = "NULL";
  }
  sVar2 = strlen(pcStack_18);
  iVar1 = (int)sVar2;
  if (str->size <= str->length + iVar1 + 1) {
    CuStringResize(str,str->length + iVar1 + 0x101);
  }
  str->length = iVar1 + str->length;
  strcat(str->buffer,pcStack_18);
  return;
}

Assistant:

void CuStringAppend(CuString* str, const char* text)
{
	int length;

	if (text == NULL) {
		text = "NULL";
	}

	length = strlen(text);
	if (str->length + length + 1 >= str->size)
		CuStringResize(str, str->length + length + 1 + STRING_INC);
	str->length += length;
	strcat(str->buffer, text);
}